

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::I16>
          (BinBinaryReader *this,I16 *value)

{
  ushort *puVar1;
  char **ppcVar2;
  ushort *puVar3;
  ushort *puVar4;
  bool bVar5;
  ushort uVar6;
  
  puVar3 = (ushort *)(this->reader).cur_;
  puVar4 = (ushort *)(this->reader).cap_;
  puVar1 = puVar3 + 1;
  if (puVar4 < puVar1) {
    bVar5 = fail_msg(this,"reader.read(value.value)",(this->reader).cur_);
    uVar6 = (ushort)bVar5;
  }
  else {
    uVar6 = *puVar3;
    value->value = uVar6;
    ppcVar2 = &(this->reader).cur_;
    *ppcVar2 = *ppcVar2 + 2;
  }
  return (bool)(puVar1 <= puVar4 | (byte)uVar6 & 1);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }